

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_remove_window(nk_context *ctx,nk_window *win)

{
  byte *pbVar1;
  nk_window *pnVar2;
  nk_window *pnVar3;
  
  if (ctx->begin == win) {
LAB_0011d8db:
    pnVar3 = win->next;
    ctx->begin = pnVar3;
    if (pnVar3 != (nk_window *)0x0) {
      pnVar3->prev = (nk_window *)0x0;
    }
LAB_0011d8f9:
    if (ctx->end != win) goto LAB_0011d91e;
    pnVar3 = win->prev;
    ctx->end = pnVar3;
    if (pnVar3 == (nk_window *)0x0) goto LAB_0011d91e;
    pnVar2 = (nk_window *)0x0;
  }
  else {
    if (ctx->end == win) {
      if (ctx->begin == win) goto LAB_0011d8db;
      goto LAB_0011d8f9;
    }
    pnVar2 = win->next;
    if (pnVar2 != (nk_window *)0x0) {
      pnVar2->prev = win->prev;
    }
    pnVar3 = win->prev;
    if (pnVar3 == (nk_window *)0x0) goto LAB_0011d91e;
  }
  pnVar3->next = pnVar2;
LAB_0011d91e:
  if (ctx->active == win || ctx->active == (nk_window *)0x0) {
    pnVar3 = ctx->end;
    ctx->active = pnVar3;
    if (pnVar3 != (nk_window *)0x0) {
      pbVar1 = (byte *)((long)&pnVar3->flags + 1);
      *pbVar1 = *pbVar1 & 0xef;
    }
  }
  win->next = (nk_window *)0x0;
  win->prev = (nk_window *)0x0;
  ctx->count = ctx->count - 1;
  return;
}

Assistant:

NK_LIB void
nk_remove_window(struct nk_context *ctx, struct nk_window *win)
{
    if (win == ctx->begin || win == ctx->end) {
        if (win == ctx->begin) {
            ctx->begin = win->next;
            if (win->next)
                win->next->prev = 0;
        }
        if (win == ctx->end) {
            ctx->end = win->prev;
            if (win->prev)
                win->prev->next = 0;
        }
    } else {
        if (win->next)
            win->next->prev = win->prev;
        if (win->prev)
            win->prev->next = win->next;
    }
    if (win == ctx->active || !ctx->active) {
        ctx->active = ctx->end;
        if (ctx->end)
            ctx->end->flags &= ~(nk_flags)NK_WINDOW_ROM;
    }
    win->next = 0;
    win->prev = 0;
    ctx->count--;
}